

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O3

vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *
license::LicenseGenerator::parseLicenseInfo
          (vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
           *__return_storage_ptr__,variables_map *vm)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *this;
  _Base_ptr p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint from_sw_version;
  uint to_sw_version;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  const_iterator cVar6;
  any *paVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  tm *__tp;
  uint *puVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ostream *poVar10;
  string *in_RCX;
  string *psVar11;
  char *__end;
  pointer product;
  string client_signature;
  string dt_end;
  _Alloc_hider local_218;
  char local_208 [16];
  _Alloc_hider local_1f8;
  char local_1e8 [24];
  _Alloc_hider local_1d0;
  char local_1c0 [16];
  _Alloc_hider local_1b0;
  char local_1a0 [32];
  _Alloc_hider local_180;
  char local_170 [24];
  _Alloc_hider local_158;
  char local_148 [16];
  string extra_data;
  string local_118;
  undefined1 local_f8 [16];
  char local_e8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  string local_b0;
  string local_90;
  string begin_date;
  string end_date;
  
  psVar11 = &client_signature;
  std::__cxx11::string::string
            ((string *)&begin_date,FullLicenseInfo::UNUSED_TIME,(allocator *)&dt_end);
  std::__cxx11::string::string
            ((string *)&end_date,FullLicenseInfo::UNUSED_TIME,(allocator *)&dt_end);
  dt_end._M_dataplus._M_p = (pointer)&dt_end.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dt_end,"expire_date","");
  this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          *)(vm + 0x10);
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(this,&dt_end);
  p_Var1 = (_Base_ptr)(vm + 0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
    operator_delete(dt_end._M_dataplus._M_p);
  }
  if (cVar6._M_node != p_Var1) {
    paVar2 = &client_signature.field_2;
    client_signature._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&client_signature,"expire_date","");
    paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]
                              ((abstract_variables_map *)vm,(string *)&client_signature);
    pbVar8 = boost::any_cast<std::__cxx11::string_const&>(paVar7);
    dt_end._M_dataplus._M_p = (pointer)&dt_end.field_2;
    pcVar3 = (pbVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&dt_end,pcVar3,pcVar3 + pbVar8->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)client_signature._M_dataplus._M_p != paVar2) {
      operator_delete(client_signature._M_dataplus._M_p);
    }
    normalize_date(&client_signature,&dt_end);
    std::__cxx11::string::operator=((string *)&end_date,(string *)&client_signature);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)client_signature._M_dataplus._M_p != paVar2) {
      operator_delete(client_signature._M_dataplus._M_p);
    }
    extra_data._M_dataplus._M_p = (pointer)time((time_t *)0x0);
    __tp = localtime((time_t *)&extra_data);
    strftime((char *)&client_signature,0x14,"%Y-%m-%d",__tp);
    sVar4 = begin_date._M_string_length;
    strlen((char *)&client_signature);
    std::__cxx11::string::_M_replace((ulong)&begin_date,0,(char *)sVar4,(ulong)&client_signature);
    in_RCX = psVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
      operator_delete(dt_end._M_dataplus._M_p);
      in_RCX = psVar11;
    }
  }
  dt_end._M_dataplus._M_p = (pointer)&dt_end.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dt_end,"begin_date","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(this,&dt_end);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
    operator_delete(dt_end._M_dataplus._M_p);
  }
  if (cVar6._M_node != p_Var1) {
    paVar2 = &client_signature.field_2;
    client_signature._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&client_signature,"begin_date","");
    paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]
                              ((abstract_variables_map *)vm,(string *)&client_signature);
    pbVar8 = boost::any_cast<std::__cxx11::string_const&>(paVar7);
    in_RCX = (string *)&dt_end.field_2;
    pcVar3 = (pbVar8->_M_dataplus)._M_p;
    dt_end._M_dataplus._M_p = (pointer)in_RCX;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&dt_end,pcVar3,pcVar3 + pbVar8->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)client_signature._M_dataplus._M_p != paVar2) {
      operator_delete(client_signature._M_dataplus._M_p);
    }
    normalize_date(&client_signature,&dt_end);
    std::__cxx11::string::operator=((string *)&begin_date,(string *)&client_signature);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)client_signature._M_dataplus._M_p != paVar2) {
      operator_delete(client_signature._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
      operator_delete(dt_end._M_dataplus._M_p);
    }
  }
  client_signature._M_dataplus._M_p = (pointer)&client_signature.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&client_signature,"");
  dt_end._M_dataplus._M_p = (pointer)&dt_end.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dt_end,"client_signature","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(this,&dt_end);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
    operator_delete(dt_end._M_dataplus._M_p);
  }
  if (cVar6._M_node != p_Var1) {
    dt_end._M_dataplus._M_p = (pointer)&dt_end.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dt_end,"client_signature","");
    paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]
                              ((abstract_variables_map *)vm,(string *)&dt_end);
    boost::any_cast<std::__cxx11::string_const&>(paVar7);
    std::__cxx11::string::_M_assign((string *)&client_signature);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
      operator_delete(dt_end._M_dataplus._M_p);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&extra_data,
               "[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}",0x10);
    dt_end.field_2._M_allocated_capacity = 0;
    dt_end.field_2._8_8_ = 0;
    dt_end._M_dataplus._M_p = (pointer)0x0;
    dt_end._M_string_length = 0;
    in_RCX = &extra_data;
    bVar5 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )client_signature._M_dataplus._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(client_signature._M_dataplus._M_p + client_signature._M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&dt_end,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_RCX,0);
    if (dt_end._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(dt_end._M_dataplus._M_p);
    }
    if (!bVar5) {
      poVar10 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"Client signature not recognized: ",0x21);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,client_signature._M_dataplus._M_p,
                           client_signature._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," Please enter a valid signature in format XXXX-XXXX-XXXX-XXXX",0x3d);
      std::endl<char,std::char_traits<char>>(poVar10);
      goto LAB_0028cf56;
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&extra_data);
  }
  extra_data._M_dataplus._M_p = (pointer)&extra_data.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&extra_data,"");
  dt_end._M_dataplus._M_p = (pointer)&dt_end.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dt_end,"extra_data","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(this,&dt_end);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
    operator_delete(dt_end._M_dataplus._M_p);
  }
  if (cVar6._M_node != p_Var1) {
    dt_end._M_dataplus._M_p = (pointer)&dt_end.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dt_end,"extra_data","");
    paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]
                              ((abstract_variables_map *)vm,(string *)&dt_end);
    boost::any_cast<std::__cxx11::string_const&>(paVar7);
    std::__cxx11::string::_M_assign((string *)&extra_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
      operator_delete(dt_end._M_dataplus._M_p);
    }
  }
  dt_end._M_dataplus._M_p = (pointer)&dt_end.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dt_end,"start_version","");
  paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]
                            ((abstract_variables_map *)vm,(string *)&dt_end);
  puVar9 = boost::any_cast<unsigned_int_const&>(paVar7);
  from_sw_version = *puVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
    operator_delete(dt_end._M_dataplus._M_p);
  }
  dt_end._M_dataplus._M_p = (pointer)&dt_end.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dt_end,"end_version","");
  paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]
                            ((abstract_variables_map *)vm,(string *)&dt_end);
  puVar9 = boost::any_cast<unsigned_int_const&>(paVar7);
  to_sw_version = *puVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
    operator_delete(dt_end._M_dataplus._M_p);
  }
  dt_end._M_dataplus._M_p = (pointer)&dt_end.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dt_end,"product","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(this,&dt_end);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
    operator_delete(dt_end._M_dataplus._M_p);
  }
  if (cVar6._M_node != p_Var1) {
    dt_end._M_dataplus._M_p = (pointer)&dt_end.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dt_end,"product","");
    paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]
                              ((abstract_variables_map *)vm,(string *)&dt_end);
    __x = boost::
          any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                    (paVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&products,__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
      operator_delete(dt_end._M_dataplus._M_p);
    }
    (__return_storage_ptr__->
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>)._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>)._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>)._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::reserve
              (__return_storage_ptr__,
               (long)products.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)products.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    if (products.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        products.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      product = products.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::locale::locale((locale *)&local_118);
        local_f8._0_2_ = 0x2000;
        std::locale::locale((locale *)(local_f8 + 8),(locale *)&local_118);
        boost::algorithm::
        trim_copy_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dt_end,
                   (algorithm *)product,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   (is_classifiedF *)in_RCX);
        std::locale::~locale((locale *)(local_f8 + 8));
        sVar4 = dt_end._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
          operator_delete(dt_end._M_dataplus._M_p);
        }
        std::locale::~locale((locale *)&local_118);
        if (sVar4 != 0) {
          local_f8._0_8_ = local_e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"","");
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"","");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,begin_date._M_dataplus._M_p,
                     begin_date._M_dataplus._M_p + begin_date._M_string_length);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,end_date._M_dataplus._M_p,
                     end_date._M_dataplus._M_p + end_date._M_string_length);
          in_RCX = &local_118;
          FullLicenseInfo::FullLicenseInfo
                    ((FullLicenseInfo *)&dt_end,(string *)local_f8,product,in_RCX,0x6e,&local_b0,
                     &local_90,&client_signature,from_sw_version,to_sw_version,&extra_data);
          std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
          emplace_back<license::FullLicenseInfo>(__return_storage_ptr__,(FullLicenseInfo *)&dt_end);
          if (local_158._M_p != local_148) {
            operator_delete(local_158._M_p);
          }
          if (local_180._M_p != local_170) {
            operator_delete(local_180._M_p);
          }
          if (local_1b0._M_p != local_1a0) {
            operator_delete(local_1b0._M_p);
          }
          if (local_1d0._M_p != local_1c0) {
            operator_delete(local_1d0._M_p);
          }
          if (local_1f8._M_p != local_1e8) {
            operator_delete(local_1f8._M_p);
          }
          if (local_218._M_p != local_208) {
            operator_delete(local_218._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dt_end._M_dataplus._M_p != &dt_end.field_2) {
            operator_delete(dt_end._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if ((char *)local_f8._0_8_ != local_e8) {
            operator_delete((void *)local_f8._0_8_);
          }
        }
        product = product + 1;
      } while (product !=
               products.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&products);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)extra_data._M_dataplus._M_p != &extra_data.field_2) {
      operator_delete(extra_data._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)client_signature._M_dataplus._M_p != &client_signature.field_2) {
      operator_delete(client_signature._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)end_date._M_dataplus._M_p != &end_date.field_2) {
      operator_delete(end_date._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)begin_date._M_dataplus._M_p != &begin_date.field_2) {
      operator_delete(begin_date._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  poVar10 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Parameter [product] not found. ",0x1f)
  ;
  std::endl<char,std::char_traits<char>>(poVar10);
LAB_0028cf56:
  exit(2);
}

Assistant:

vector<FullLicenseInfo> LicenseGenerator::parseLicenseInfo(
		const po::variables_map& vm) {
	string begin_date = FullLicenseInfo::UNUSED_TIME;
	string end_date = FullLicenseInfo::UNUSED_TIME;
	if (vm.count("expire_date")) {
		const std::string dt_end = vm["expire_date"].as<string>();
		try {
			end_date = normalize_date(dt_end);
			char curdate[20];
			time_t curtime = time(NULL);
			strftime(curdate, 20, "%Y-%m-%d", localtime(&curtime));
			begin_date.assign(curdate);
		} catch (const invalid_argument &e) {
			cerr << endl << "End date not recognized: " << dt_end
					<< " Please enter a valid date in format YYYYMMDD" << endl;
			exit(2);
		}
	}
	if (vm.count("begin_date")) {
		const std::string begin_date_str = vm["begin_date"].as<string>();
		try {
			begin_date = normalize_date(begin_date_str);
		} catch (invalid_argument &e) {
			cerr << endl << "Begin date not recognized: " << begin_date_str
					<< " Please enter a valid date in format YYYYMMDD" << endl;
			//print_usage(vm);
			exit(2);
		}
	}
	string client_signature = "";
	if (vm.count("client_signature")) {
		client_signature = vm["client_signature"].as<string>();
		regex e("[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}-[A-Za-z0-9\\+/]{4}");
		if (!regex_match(client_signature, e)) {
			cerr << endl << "Client signature not recognized: "
				<< client_signature
				<< " Please enter a valid signature in format XXXX-XXXX-XXXX-XXXX"
				<< endl;
			exit(2);
		}
	}
	string extra_data = "";
	if (vm.count("extra_data")) {
		extra_data = vm["extra_data"].as<string>();
	}
	unsigned int from_sw_version = vm["start_version"].as<unsigned int>();
	unsigned int to_sw_version = vm["end_version"].as<unsigned int>();
	if (vm.count("product") == 0) {
		cerr << endl << "Parameter [product] not found. " << endl;
		exit(2);
	}
	vector<string> products = vm["product"].as<vector<string>>();
	vector<FullLicenseInfo> licInfo;
	licInfo.reserve(products.size());
	for (auto it = products.begin(); it != products.end(); it++) {
		if (boost::algorithm::trim_copy(*it).length() > 0) {
			licInfo.push_back(
					FullLicenseInfo("", *it, "", PROJECT_INT_VERSION,
							begin_date, end_date, client_signature,
							from_sw_version, to_sw_version, extra_data));
		}
	}
	return licInfo;
}